

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

void xmlTextWriterStartDocumentCallback(void *ctx)

{
  htmlDocPtr pxVar1;
  xmlChar *pxVar2;
  xmlDocPtr local_20;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  void *ctx_local;
  
  if (*(int *)((long)ctx + 0x34) == 0) {
    local_20 = *(xmlDocPtr *)((long)ctx + 0x10);
    if (local_20 == (xmlDocPtr)0x0) {
      local_20 = xmlNewDoc(*(xmlChar **)((long)ctx + 0x20));
      *(xmlDocPtr *)((long)ctx + 0x10) = local_20;
    }
    if (local_20 == (xmlDocPtr)0x0) {
      if ((*ctx != 0) && (*(long *)(*ctx + 0xb0) != 0)) {
        (**(code **)(*ctx + 0xb0))
                  (*(undefined8 *)((long)ctx + 8),"SAX.startDocument(): out of memory\n");
      }
      *(undefined4 *)((long)ctx + 0x88) = 2;
      *(undefined4 *)((long)ctx + 0x110) = 0xffffffff;
      *(undefined4 *)((long)ctx + 0x14c) = 1;
      return;
    }
    if (local_20->children == (_xmlNode *)0x0) {
      if (*(long *)((long)ctx + 0x28) == 0) {
        local_20->encoding = (xmlChar *)0x0;
      }
      else {
        pxVar2 = xmlStrdup(*(xmlChar **)((long)ctx + 0x28));
        local_20->encoding = pxVar2;
      }
      local_20->standalone = *(int *)((long)ctx + 0x30);
    }
  }
  else {
    if (*(long *)((long)ctx + 0x10) == 0) {
      pxVar1 = htmlNewDocNoDtD((xmlChar *)0x0,(xmlChar *)0x0);
      *(htmlDocPtr *)((long)ctx + 0x10) = pxVar1;
    }
    if (*(long *)((long)ctx + 0x10) == 0) {
      if ((*ctx != 0) && (*(long *)(*ctx + 0xb0) != 0)) {
        (**(code **)(*ctx + 0xb0))
                  (*(undefined8 *)((long)ctx + 8),"SAX.startDocument(): out of memory\n");
      }
      *(undefined4 *)((long)ctx + 0x88) = 2;
      *(undefined4 *)((long)ctx + 0x110) = 0xffffffff;
      *(undefined4 *)((long)ctx + 0x14c) = 1;
      return;
    }
  }
  if ((((*(long *)((long)ctx + 0x10) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x88) == 0))
      && (*(long *)((long)ctx + 0x38) != 0)) && (*(long *)(*(long *)((long)ctx + 0x38) + 8) != 0)) {
    pxVar2 = xmlCanonicPath(*(xmlChar **)(*(long *)((long)ctx + 0x38) + 8));
    *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar2;
    if (*(long *)(*(long *)((long)ctx + 0x10) + 0x88) == 0) {
      pxVar2 = xmlStrdup(*(xmlChar **)(*(long *)((long)ctx + 0x38) + 8));
      *(xmlChar **)(*(long *)((long)ctx + 0x10) + 0x88) = pxVar2;
    }
  }
  return;
}

Assistant:

static void
xmlTextWriterStartDocumentCallback(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlDocPtr doc;

    if (ctxt->html) {
#ifdef LIBXML_HTML_ENABLED
        if (ctxt->myDoc == NULL)
            ctxt->myDoc = htmlNewDocNoDtD(NULL, NULL);
        if (ctxt->myDoc == NULL) {
            if ((ctxt->sax != NULL) && (ctxt->sax->error != NULL))
                ctxt->sax->error(ctxt->userData,
                                 "SAX.startDocument(): out of memory\n");
            ctxt->errNo = XML_ERR_NO_MEMORY;
            ctxt->instate = XML_PARSER_EOF;
            ctxt->disableSAX = 1;
            return;
        }
#else
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "libxml2 built without HTML support\n");
        ctxt->errNo = XML_ERR_INTERNAL_ERROR;
        ctxt->instate = XML_PARSER_EOF;
        ctxt->disableSAX = 1;
        return;
#endif
    } else {
        doc = ctxt->myDoc;
        if (doc == NULL)
            doc = ctxt->myDoc = xmlNewDoc(ctxt->version);
        if (doc != NULL) {
            if (doc->children == NULL) {
                if (ctxt->encoding != NULL)
                    doc->encoding = xmlStrdup(ctxt->encoding);
                else
                    doc->encoding = NULL;
                doc->standalone = ctxt->standalone;
            }
        } else {
            if ((ctxt->sax != NULL) && (ctxt->sax->error != NULL))
                ctxt->sax->error(ctxt->userData,
                                 "SAX.startDocument(): out of memory\n");
            ctxt->errNo = XML_ERR_NO_MEMORY;
            ctxt->instate = XML_PARSER_EOF;
            ctxt->disableSAX = 1;
            return;
        }
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->URL == NULL) &&
        (ctxt->input != NULL) && (ctxt->input->filename != NULL)) {
        ctxt->myDoc->URL =
            xmlCanonicPath((const xmlChar *) ctxt->input->filename);
        if (ctxt->myDoc->URL == NULL)
            ctxt->myDoc->URL =
                xmlStrdup((const xmlChar *) ctxt->input->filename);
    }
}